

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::EnhancedLayouts::XFBOverrideQualifiersWithAPITest::inspectProgram
          (XFBOverrideQualifiersWithAPITest *this,GLuint test_case_index,Program *program,
          stringstream *out_stream)

{
  GLint GVar1;
  GLuint GVar2;
  ostream *poVar3;
  GLint stride;
  Type local_38;
  
  stride = 0;
  local_38 = TestBase::getType((TestBase *)this,test_case_index);
  GVar2 = Utils::Type::GetSize(&local_38);
  Utils::Program::GetResource(program,0x8c8e,0,0x934c,1,&stride);
  GVar1 = stride;
  if (GVar2 * 3 != stride) {
    poVar3 = std::operator<<((ostream *)(out_stream + 0x10),"Stride is: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,stride);
    poVar3 = std::operator<<(poVar3," expected: ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  }
  return GVar2 * 3 == GVar1;
}

Assistant:

bool XFBOverrideQualifiersWithAPITest::inspectProgram(GLuint test_case_index, Utils::Program& program,
													  std::stringstream& out_stream)
{
	GLint			   stride	= 0;
	const Utils::Type& type		 = getType(test_case_index);
	const GLuint	   type_size = type.GetSize();

	program.GetResource(GL_TRANSFORM_FEEDBACK_BUFFER, 0 /* index */, GL_TRANSFORM_FEEDBACK_BUFFER_STRIDE,
						1 /* buf_size */, &stride);

	if ((GLint)(3 * type_size) != stride)
	{
		out_stream << "Stride is: " << stride << " expected: " << (3 * type_size);

		return false;
	}

	return true;
}